

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.cpp
# Opt level: O0

void __thiscall
license::License::add_parameter(License *this,string *param_name,string *param_value)

{
  char cVar1;
  string *psVar2;
  bool bVar3;
  mapped_type *pmVar4;
  long lVar5;
  invalid_argument *this_00;
  ostream *poVar6;
  logic_error *plVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  path local_c8;
  undefined1 local_a2;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_50;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_30;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_28;
  string *local_20;
  string *param_value_local;
  string *param_name_local;
  License *this_local;
  
  local_20 = param_value;
  param_value_local = param_name;
  param_name_local = (string *)this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)NO_OUTPUT_PARAM_abi_cxx11_,param_name);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)NO_OUTPUT_PARAM_abi_cxx11_);
  bVar3 = std::__detail::operator==(&local_28,&local_30);
  if (bVar3) {
    lVar5 = std::__cxx11::string::find((char *)param_value_local,0x4978bf);
    if (((lVar5 == -1) &&
        (lVar5 = std::__cxx11::string::find((char *)param_value_local,0x43f4dd), lVar5 == -1)) &&
       (lVar5 = std::__cxx11::string::find((char *)param_value_local,0x43e494), lVar5 == -1)) {
      lVar5 = std::__cxx11::string::find((char *)param_value_local,0x46acf8);
      psVar2 = local_20;
      if (lVar5 == -1) {
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->values_map,param_value_local);
        std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar2);
      }
      else {
        bVar3 = std::operator!=(local_20,"0");
        psVar2 = local_20;
        if (bVar3) {
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->values_map,param_value_local);
          std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar2);
        }
      }
    }
    else {
      normalize_date(&local_50,local_20);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->values_map,param_value_local);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  else {
    bVar3 = std::operator==("feature-names",param_value_local);
    if (bVar3) {
      std::__cxx11::string::operator=((string *)&this->m_feature_names,(string *)local_20);
      cVar1 = (char)this;
      lVar5 = std::__cxx11::string::find(cVar1 + '(',0x5b);
      if ((((lVar5 != -1) || (lVar5 = std::__cxx11::string::find(cVar1 + '(',0x5d), lVar5 != -1)) ||
          (lVar5 = std::__cxx11::string::find(cVar1 + '(',0x2f), lVar5 != -1)) ||
         (lVar5 = std::__cxx11::string::find(cVar1 + '(',0x5c), lVar5 != -1)) {
        local_a2 = 1;
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_a0,
                   "feature name should not contain any of \'[ ] / \' characters. Parameter feature-namesvalue :"
                   ,&local_a1);
        std::operator+(&local_80,&local_a0,param_value_local);
        std::invalid_argument::invalid_argument(this_00,(string *)&local_80);
        local_a2 = 0;
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
    }
    else {
      bVar3 = std::operator==("primary-key",param_value_local);
      if (bVar3) {
        boost::filesystem::path::path(&local_c8,local_20);
        bVar3 = boost::filesystem::exists(&local_c8);
        boost::filesystem::path::~path(&local_c8);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Primary key ");
          poVar6 = std::operator<<(poVar6,(string *)local_20);
          poVar6 = std::operator<<(poVar6," not found.");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          local_109 = 1;
          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_108,"Primary key [",local_20);
          std::operator+(&local_e8,&local_108,"] not found");
          std::logic_error::logic_error(plVar7,(string *)&local_e8);
          local_109 = 0;
          __cxa_throw(plVar7,std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        std::__cxx11::string::operator=((string *)&this->m_private_key,(string *)local_20);
      }
      else {
        bVar3 = std::operator==("output-file-name",param_value_local);
        if ((!bVar3) && (bVar3 = std::operator==("project-folder",param_value_local), !bVar3)) {
          plVar7 = (logic_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_130,param_value_local," not recognized");
          std::logic_error::logic_error(plVar7,(string *)&local_130);
          __cxa_throw(plVar7,std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
      }
    }
  }
  return;
}

Assistant:

void License::add_parameter(const std::string &param_name, const std::string &param_value) {
	if (NO_OUTPUT_PARAM.find(param_name) == NO_OUTPUT_PARAM.end()) {
		if (param_name.find("date") != std::string::npos || param_name.find(PARAM_EXPIRY_DATE) != std::string::npos ||
			param_name.find(PARAM_BEGIN_DATE) != std::string::npos) {
			values_map[param_name] = normalize_date(param_value);
		} else if (param_name.find("version") != std::string::npos) {
			if (param_value != "0") {
				values_map[param_name] = param_value;
			}
		} else {
			values_map[param_name] = param_value;
		}
	} else if (PARAM_FEATURE_NAMES == param_name) {
		m_feature_names = param_value;
		if (m_feature_names.find('[') != std::string::npos || m_feature_names.find(']') != std::string::npos ||
			m_feature_names.find('/') != std::string::npos || m_feature_names.find('\\') != std::string::npos) {
			throw invalid_argument(
				string("feature name should not contain any of '[ ] / \' characters. Parameter " PARAM_FEATURE_NAMES
					   "value :") +
				param_name);
		}
	} else if (PARAM_PRIMARY_KEY == param_name) {
		if (!fs::exists(param_value)) {
			cerr << "Primary key " << param_value << " not found." << endl;
			throw logic_error("Primary key [" + param_value + "] not found");
		}
		m_private_key = param_value;
	} else if (PARAM_LICENSE_OUTPUT == param_name || PARAM_PROJECT_FOLDER == param_name) {
		// just ignore
	} else {
		throw logic_error(param_name + " not recognized");
	}
}